

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

ptr<StatementBlock> __thiscall Parser::statementBlock(Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  ptr<StatementBlock> pVar1;
  undefined1 local_39;
  vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_> local_38;
  
  consume(in_RSI,LeftCurly,"\'{\'");
  statements(&local_38,in_RSI);
  (this->filepath)._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<StatementBlock,std::allocator<StatementBlock>,std::vector<std::shared_ptr<Statement>,std::allocator<std::shared_ptr<Statement>>>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->filepath)._M_string_length,
             (StatementBlock **)this,(allocator<StatementBlock> *)&local_39,&local_38);
  std::vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>::~vector
            (&local_38);
  consume(in_RSI,RightCurly,"\'}\'");
  pVar1.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (ptr<StatementBlock>)pVar1.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<StatementBlock> Parser::statementBlock() {
    consume(TokenType::LeftCurly, "'{'");

    ptr<StatementBlock> statBlock = make<StatementBlock>(statements());

    consume(TokenType::RightCurly, "'}'");

    return statBlock;
}